

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFormatting.cpp
# Opt level: O0

void __thiscall
llvm::write_hex(llvm *this,raw_ostream *S,uint64_t N,HexPrintStyle Style,
               Optional<unsigned_long> Width)

{
  char cVar1;
  unsigned_long *puVar2;
  size_t sVar3;
  uint *puVar4;
  undefined4 in_register_0000000c;
  undefined8 uVar5;
  size_t __n;
  bool local_fb;
  bool local_fa;
  char *pcStack_f8;
  uchar x;
  char *CurPtr;
  char *EndPtr;
  char NumberBuffer [128];
  uint local_60;
  uint local_5c;
  int local_58;
  uint NumChars;
  uint PrefixChars;
  bool Upper;
  uint uStack_4c;
  bool Prefix;
  uint Nibbles;
  unsigned_long local_40;
  size_t W;
  size_t kMaxWidth;
  raw_ostream *prStack_28;
  HexPrintStyle Style_local;
  uint64_t N_local;
  raw_ostream *S_local;
  Optional<unsigned_long> Width_local;
  
  S_local = (raw_ostream *)CONCAT44(in_register_0000000c,Style);
  Width_local.Storage.storage.super_AlignedCharArray<8UL,_8UL>.buffer[0] =
       Width.Storage.storage.super_AlignedCharArray<8UL,_8UL>.buffer[0];
  kMaxWidth._4_4_ = (int)N;
  W = 0x80;
  uStack_4c = 0;
  prStack_28 = S;
  N_local = (uint64_t)this;
  _Nibbles = Optional<unsigned_long>::getValueOr<unsigned_int>
                       ((Optional<unsigned_long> *)&S_local,&stack0xffffffffffffffb4);
  puVar2 = std::min<unsigned_long>(&W,(unsigned_long *)&Nibbles);
  local_40 = *puVar2;
  sVar3 = countLeadingZeros<unsigned_long>((unsigned_long)prStack_28,ZB_Width);
  PrefixChars = (uint)(0x43 - sVar3 >> 2);
  local_fa = kMaxWidth._4_4_ == 3 || kMaxWidth._4_4_ == 2;
  NumChars._3_1_ = local_fa;
  local_fb = kMaxWidth._4_4_ == 0 || kMaxWidth._4_4_ == 2;
  NumChars._2_1_ = local_fb;
  local_58 = 0;
  if (kMaxWidth._4_4_ == 3 || kMaxWidth._4_4_ == 2) {
    local_58 = 2;
  }
  local_60 = (uint)local_40;
  NumberBuffer[0x78] = '\x01';
  NumberBuffer[0x79] = '\0';
  NumberBuffer[0x7a] = '\0';
  NumberBuffer[0x7b] = '\0';
  puVar4 = std::max<unsigned_int>((uint *)(NumberBuffer + 0x78),&PrefixChars);
  NumberBuffer._124_4_ = *puVar4 + local_58;
  puVar4 = std::max<unsigned_int>(&local_60,(uint *)(NumberBuffer + 0x7c));
  local_5c = *puVar4;
  sVar3 = array_lengthof<char,128ul>((char (*) [128])&EndPtr);
  memset(&EndPtr,0x30,sVar3);
  if ((NumChars._3_1_ & 1) != 0) {
    EndPtr._1_1_ = 0x78;
  }
  __n = (size_t)local_5c;
  pcStack_f8 = NumberBuffer + (__n - 8);
  for (; prStack_28 != (raw_ostream *)0x0; prStack_28 = (raw_ostream *)((ulong)prStack_28 >> 4)) {
    uVar5 = 0;
    cVar1 = hexdigit((uint)(byte)(((ulong)prStack_28 & 0xff) % 0x10),
                     (bool)((NumChars._2_1_ ^ 0xff) & 1));
    __n = CONCAT71((int7)((ulong)uVar5 >> 8),cVar1);
    pcStack_f8[-1] = cVar1;
    pcStack_f8 = pcStack_f8 + -1;
  }
  raw_ostream::write((raw_ostream *)N_local,(int)&EndPtr,(void *)(ulong)local_5c,__n);
  return;
}

Assistant:

void llvm::write_hex(raw_ostream &S, uint64_t N, HexPrintStyle Style,
                     Optional<size_t> Width) {
  const size_t kMaxWidth = 128u;

  size_t W = std::min(kMaxWidth, Width.getValueOr(0u));

  unsigned Nibbles = (64 - countLeadingZeros(N) + 3) / 4;
  bool Prefix = (Style == HexPrintStyle::PrefixLower ||
                 Style == HexPrintStyle::PrefixUpper);
  bool Upper =
      (Style == HexPrintStyle::Upper || Style == HexPrintStyle::PrefixUpper);
  unsigned PrefixChars = Prefix ? 2 : 0;
  unsigned NumChars =
      std::max(static_cast<unsigned>(W), std::max(1u, Nibbles) + PrefixChars);

  char NumberBuffer[kMaxWidth];
  ::memset(NumberBuffer, '0', llvm::array_lengthof(NumberBuffer));
  if (Prefix)
    NumberBuffer[1] = 'x';
  char *EndPtr = NumberBuffer + NumChars;
  char *CurPtr = EndPtr;
  while (N) {
    unsigned char x = static_cast<unsigned char>(N) % 16;
    *--CurPtr = hexdigit(x, !Upper);
    N /= 16;
  }

  S.write(NumberBuffer, NumChars);
}